

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.h
# Opt level: O1

void embree::MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
               (EvalFunc *eval,Interval1f *interval,uint *numRoots,float *roots,uint maxNumRoots)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  Interval1f range;
  Interval1f local_40;
  float local_38;
  float local_34;
  
  motion_derivative_regression_test::run::EvalFunc::operator()
            ((EvalFunc *)&local_38,(Interval1f *)eval);
  if (((local_38 <= 0.0) && (0.0 <= local_34)) && (local_38 < local_34)) {
    local_40.lower = interval->lower;
    fVar1 = interval->upper;
    fVar5 = (fVar1 + local_40.lower) * 0.5;
    if (((fVar1 - local_40.lower < 1e-07) || (ABS(fVar5 - local_40.lower) < 1e-07)) ||
       (ABS(fVar5 - fVar1) < 1e-07)) {
      uVar2 = *numRoots;
      uVar3 = uVar2;
      if (maxNumRoots < uVar2) {
        uVar3 = maxNumRoots;
      }
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          if (ABS(roots[uVar4] - fVar5) < 0.0001) {
            return;
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      if (uVar2 < maxNumRoots) {
        *numRoots = uVar2 + 1;
        roots[uVar2] = fVar5;
      }
      if (maxNumRoots < *numRoots) {
        puts("error: more roots than expected");
      }
    }
    else {
      local_40.upper = fVar5;
      findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                (eval,&local_40,numRoots,roots,maxNumRoots);
      local_40.upper = interval->upper;
      local_40.lower = fVar5;
      findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                (eval,&local_40,numRoots,roots,maxNumRoots);
    }
  }
  return;
}

Assistant:

static void findRoots(

    Eval const& eval,
    Interval1f const& interval,
    unsigned int& numRoots,
    float* roots,
    unsigned int maxNumRoots)
  {
    Interval1f range = eval(interval);
    if (range.lower > 0 || range.upper < 0 || range.lower >= range.upper) return;

    const float split = 0.5f * (interval.upper + interval.lower);
    if (interval.upper-interval.lower < 1e-7f || abs(split-interval.lower) < 1e-7f ||  abs(split-interval.upper) < 1e-7f)
    {
      // check if the root already exists
      for (unsigned int k = 0; k < numRoots && k < maxNumRoots; ++k) {
        if (abs(roots[k]-split) < MOTION_DERIVATIVE_ROOT_EPSILON)
        return;
      }
      if (numRoots < maxNumRoots) {
        roots[numRoots++] = split;
      }
      if (numRoots > maxNumRoots) {
        printf("error: more roots than expected\n"); // FIXME: workaround for ICC2019.4 compiler bug under macOS
        return;
      }
      return;
    }

    findRoots(eval, Interval1f(interval.lower, split), numRoots, roots, maxNumRoots);
    findRoots(eval, Interval1f(split, interval.upper), numRoots, roots, maxNumRoots);
  }